

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool pugi::impl::anon_unknown_0::is_attribute_of(xml_attribute_struct *attr,xml_node_struct *node)

{
  xml_attribute_struct *pxVar1;
  xml_attribute_struct **ppxVar2;
  
  ppxVar2 = &node->first_attribute;
  do {
    pxVar1 = *ppxVar2;
    if (pxVar1 == attr) break;
    ppxVar2 = &pxVar1->next_attribute;
  } while (pxVar1 != (xml_attribute_struct *)0x0);
  return pxVar1 != (xml_attribute_struct *)0x0;
}

Assistant:

PUGI__FN bool is_attribute_of(xml_attribute_struct* attr, xml_node_struct* node)
	{
		for (xml_attribute_struct* a = node->first_attribute; a; a = a->next_attribute)
			if (a == attr)
				return true;

		return false;
	}